

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_strnicmp(char *zLeft,char *zRight,int N)

{
  bool bVar1;
  int local_40;
  byte *local_38;
  uchar *b;
  uchar *a;
  int N_local;
  char *zRight_local;
  char *zLeft_local;
  
  if (zLeft == (char *)0x0) {
    zLeft_local._4_4_ = 0;
    if (zRight != (char *)0x0) {
      zLeft_local._4_4_ = -1;
    }
  }
  else {
    local_38 = (byte *)zRight;
    b = (uchar *)zLeft;
    a._4_4_ = N;
    if (zRight == (char *)0x0) {
      zLeft_local._4_4_ = 1;
    }
    else {
      while( true ) {
        bVar1 = false;
        if ((0 < a._4_4_) && (bVar1 = false, *b != '\0')) {
          bVar1 = ""[*b] == ""[*local_38];
        }
        if (!bVar1) break;
        b = b + 1;
        local_38 = local_38 + 1;
        a._4_4_ = a._4_4_ + -1;
      }
      if (a._4_4_ + -1 < 0) {
        local_40 = 0;
      }
      else {
        local_40 = (uint)""[*b] - (uint)""[*local_38];
      }
      zLeft_local._4_4_ = local_40;
    }
  }
  return zLeft_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_strnicmp(const char *zLeft, const char *zRight, int N){
  register unsigned char *a, *b;
  if( zLeft==0 ){
    return zRight ? -1 : 0;
  }else if( zRight==0 ){
    return 1;
  }
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  while( N-- > 0 && *a!=0 && UpperToLower[*a]==UpperToLower[*b]){ a++; b++; }
  return N<0 ? 0 : UpperToLower[*a] - UpperToLower[*b];
}